

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::readComment(Reader *this)

{
  Char CVar1;
  bool bVar2;
  Location end;
  CommentPlacement local_28;
  bool local_22;
  CommentPlacement placement;
  bool successful;
  Char c;
  Location commentBegin;
  Reader *this_local;
  
  end = this->current_ + -1;
  CVar1 = getNextChar(this);
  local_22 = false;
  if (CVar1 == '*') {
    local_22 = readCStyleComment(this);
  }
  else if (CVar1 == '/') {
    local_22 = readCppStyleComment(this);
  }
  if (local_22 == false) {
    this_local._7_1_ = false;
  }
  else {
    if ((this->collectComments_ & 1U) != 0) {
      local_28 = commentBefore;
      if (((this->lastValueEnd_ != (Location)0x0) &&
          (bVar2 = containsNewLine(this->lastValueEnd_,end), !bVar2)) &&
         ((CVar1 != '*' || (bVar2 = containsNewLine(end,this->current_), !bVar2)))) {
        local_28 = commentAfterOnSameLine;
      }
      addComment(this,end,this->current_,local_28);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Reader::readComment() {
  Location commentBegin = current_ - 1;
  Char c = getNextChar();
  bool successful = false;
  if (c == '*')
    successful = readCStyleComment();
  else if (c == '/')
    successful = readCppStyleComment();
  if (!successful)
    return false;

  if (collectComments_) {
    CommentPlacement placement = commentBefore;
    if (lastValueEnd_ && !containsNewLine(lastValueEnd_, commentBegin)) {
      if (c != '*' || !containsNewLine(commentBegin, current_))
        placement = commentAfterOnSameLine;
    }

    addComment(commentBegin, current_, placement);
  }
  return true;
}